

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreciseDeltaTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PreciseDeltaTests::NegativeFractionalDeltaDoesNotOverflow(PreciseDeltaTests *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  allocator local_51;
  string local_50;
  LocationInfo local_30;
  
  uVar2 = 0;
  uVar4 = 0;
  for (iVar3 = -0x630000; iVar3 != 0; iVar3 = iVar3 + 1) {
    uVar1 = uVar2 - 0x3f5a00;
    uVar2 = uVar1 & 0x3fffffff;
    uVar4 = uVar4 + ((int)uVar1 >> 0x1e);
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_51);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x46);
  ut::is_true((uVar4 & 0xfffffffe) == 0xffff9e00,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  uVar2 = 0;
  uVar4 = 0;
  for (iVar3 = -0x630000; iVar3 != 0; iVar3 = iVar3 + 1) {
    uVar1 = uVar2 - 0x3f5a00;
    uVar2 = uVar1 & 0x3fffffff;
    uVar4 = uVar4 + ((int)uVar1 >> 0x1e);
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_51);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x55);
  ut::is_true((uVar4 & 0xfffffffe) == 0xffff9e00,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( NegativeFractionalDeltaDoesNotOverflow )
			{
				// INIT
				precise_delta d1(98, 99 * 0x10000);
				int sum = 0;

				// ACT
				d1.multiply(-256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d1.next();

				// ASSERT
				assert_is_true(-98 * 256 <= sum && sum <= -98 * 256 + 1);

				// INIT
				precise_delta d2(-98, 99 * 0x10000);

				sum = 0;

				// ACT
				d2.multiply(256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d2.next();

				// ASSERT
				assert_is_true(-98 * 256 <= sum && sum <= -98 * 256 + 1);
			}